

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O2

void __thiscall CPubKey::Serialize<DataStream>(CPubKey *this,DataStream *s)

{
  byte bVar1;
  uint64_t nSize;
  long in_FS_OFFSET;
  Span<const_unsigned_char> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->vch[0] & 0xfe) == 2) {
    nSize = 0x21;
  }
  else {
    bVar1 = this->vch[0] - 4;
    if (bVar1 < 4) {
      nSize = *(uint64_t *)(&DAT_006d3710 + (ulong)bVar1 * 8);
    }
    else {
      nSize = 0;
    }
  }
  WriteCompactSize<DataStream>(s,nSize);
  local_30.m_data = this->vch;
  local_30.m_size = nSize;
  DataStream::operator<<(s,&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const
    {
        unsigned int len = size();
        ::WriteCompactSize(s, len);
        s << Span{vch, len};
    }